

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

void __thiscall FfsParser::~FfsParser(FfsParser *this)

{
  NvramParser *pNVar1;
  MeParser *pMVar2;
  FitParser *this_00;
  
  pNVar1 = this->nvramParser;
  if (pNVar1 != (NvramParser *)0x0) {
    std::
    vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
    ::~vector(&pNVar1->messagesVector);
  }
  operator_delete(pNVar1);
  pMVar2 = this->meParser;
  if (pMVar2 != (MeParser *)0x0) {
    std::
    vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
    ::~vector(&pMVar2->messagesVector);
  }
  operator_delete(pMVar2);
  this_00 = this->fitParser;
  if (this_00 != (FitParser *)0x0) {
    FitParser::~FitParser(this_00);
  }
  operator_delete(this_00);
  std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::~vector(&this->protectedRanges);
  Bstrlib::CBString::~CBString(&this->securityInfo);
  std::__cxx11::string::~string((string *)&this->openedImage);
  std::
  vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  ::~vector(&this->messagesVector);
  return;
}

Assistant:

FfsParser::~FfsParser() {
    delete nvramParser;
    delete meParser;
    delete fitParser;
}